

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackArchiveGenerator.cxx
# Opt level: O0

DeduplicateStatus __thiscall
cmCPackArchiveGenerator::Deduplicator::CompareSymlink(Deduplicator *this,string *path)

{
  bool bVar1;
  __type _Var2;
  pointer ppVar3;
  mapped_type *this_00;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
  local_68;
  undefined4 local_60;
  Status local_50;
  Status status;
  string symlinkValue;
  iterator symlinkItr;
  string *path_local;
  Deduplicator *this_local;
  
  symlinkValue.field_2._8_8_ =
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::find(&this->Symlink,path);
  std::__cxx11::string::string((string *)&status);
  local_50 = cmsys::SystemTools::ReadSymlink(path,(string *)&status);
  bVar1 = cmsys::Status::IsSuccess(&local_50);
  if (bVar1) {
    local_68._M_cur =
         (__node_type *)
         std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::end(&this->Symlink);
    bVar1 = std::__detail::operator!=
                      ((_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                        *)((long)&symlinkValue.field_2 + 8),&local_68);
    if (bVar1) {
      ppVar3 = std::__detail::
               _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>
               ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>
                             *)((long)&symlinkValue.field_2 + 8));
      _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &status,&ppVar3->second);
      this_local._4_4_ = Error;
      if (_Var2) {
        this_local._4_4_ = Skip;
      }
    }
    else {
      this_00 = std::
                unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](&this->Symlink,path);
      std::__cxx11::string::operator=((string *)this_00,(string *)&status);
      this_local._4_4_ = Add;
    }
  }
  else {
    this_local._4_4_ = Error;
  }
  local_60 = 1;
  std::__cxx11::string::~string((string *)&status);
  return this_local._4_4_;
}

Assistant:

DeduplicateStatus CompareSymlink(const std::string& path)
  {
    auto symlinkItr = this->Symlink.find(path);
    std::string symlinkValue;
    auto status = cmSystemTools::ReadSymlink(path, symlinkValue);
    if (!status.IsSuccess()) {
      return DeduplicateStatus::Error;
    }

    if (symlinkItr != this->Symlink.end()) {
      return symlinkValue == symlinkItr->second ? DeduplicateStatus::Skip
                                                : DeduplicateStatus::Error;
    }

    this->Symlink[path] = symlinkValue;
    return DeduplicateStatus::Add;
  }